

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O1

Pattern * compile(Quantifier *q)

{
  vector<Pattern*,std::allocator<Pattern*>> *this;
  iterator iVar1;
  Pattern *pPVar2;
  Pattern *pPVar3;
  Pattern *ch;
  Pattern *local_30;
  Pattern *local_28;
  
  pPVar2 = (Pattern *)operator_new(0x14);
  *(undefined4 *)pPVar2 = 0xb;
  pPVar3 = (Pattern *)operator_new(0x30);
  *(undefined4 *)pPVar3 = 4;
  this = (vector<Pattern*,std::allocator<Pattern*>> *)(pPVar3 + 8);
  *(undefined8 *)(pPVar3 + 8) = 0;
  *(undefined8 *)(pPVar3 + 0x10) = 0;
  *(undefined8 *)(pPVar3 + 0x18) = 0;
  local_28 = AST::dispatch<compile_template>((q->super_Unary).child);
  *(uint *)(pPVar2 + 4) = q->minimum;
  *(uint *)(pPVar2 + 8) = q->maximum;
  pPVar2[0xc] = (Pattern)q->reluctant;
  *(undefined4 *)(pPVar2 + 0x10) = 3;
  local_30 = (Pattern *)operator_new(4);
  *(undefined4 *)local_30 = 0xc;
  iVar1._M_current = *(Pattern ***)(pPVar3 + 0x10);
  if (iVar1._M_current == *(Pattern ***)(pPVar3 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              (this,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = local_30;
    *(long *)(pPVar3 + 0x10) = *(long *)(pPVar3 + 0x10) + 8;
  }
  iVar1._M_current = *(Pattern ***)(pPVar3 + 0x10);
  local_30 = pPVar2;
  if (iVar1._M_current == *(Pattern ***)(pPVar3 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              (this,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = pPVar2;
    *(long *)(pPVar3 + 0x10) = *(long *)(pPVar3 + 0x10) + 8;
  }
  iVar1._M_current = *(Pattern ***)(pPVar3 + 0x10);
  if (iVar1._M_current == *(Pattern ***)(pPVar3 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*const&>
              (this,iVar1,&local_28);
  }
  else {
    *iVar1._M_current = local_28;
    *(long *)(pPVar3 + 0x10) = *(long *)(pPVar3 + 0x10) + 8;
  }
  local_30 = (Pattern *)operator_new(8);
  *(undefined8 *)local_30 = 0xfffffffe0000000a;
  iVar1._M_current = *(Pattern ***)(pPVar3 + 0x10);
  if (iVar1._M_current == *(Pattern ***)(pPVar3 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              (this,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = local_30;
    *(long *)(pPVar3 + 0x10) = *(long *)(pPVar3 + 0x10) + 8;
  }
  if (*(int *)local_28 == 4) {
    *(Pattern **)(local_28 + 0x20) = pPVar3;
    *(int *)(local_28 + 0x28) = 2;
  }
  return pPVar3;
}

Assistant:

static Pattern* compile(AST::Quantifier* q) {
    auto* pq = new P_Quantifier;
    auto* qseq = new P_Sequence;
    Pattern* ch = compile(q->child);

    pq->minimum = q->minimum;
    pq->maximum = q->maximum;
    pq->reluctant = q->reluctant;
    pq->offset = 3;

    qseq->v.push_back(rcps(new P_QReset));
    qseq->v.push_back(rcps(pq));
    qseq->v.push_back(ch);
    qseq->v.push_back(rcps(new P_Jump{ -2 }));

    P_Sequence* tseq = PT_dynamic_cast<P_Sequence*>(ch);
    if (tseq) {
        tseq->parent = qseq;
        tseq->iparent = 2;
    }
    return rcps(qseq);
}